

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O1

int mbedtls_x509_write_extensions(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  size_t len;
  
  if (first == (mbedtls_asn1_named_data *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      uVar1 = mbedtls_asn1_write_raw_buffer(p,start,(first->val).p + 1,(first->val).len - 1);
      uVar3 = uVar1;
      if (((-1 < (int)uVar1) &&
          (uVar2 = mbedtls_asn1_write_len(p,start,(first->val).len - 1), uVar3 = uVar2,
          -1 < (int)uVar2)) && (uVar3 = mbedtls_asn1_write_tag(p,start,'\x04'), -1 < (int)uVar3)) {
        lVar4 = (ulong)uVar3 + (ulong)(uVar2 + uVar1);
        if (*(first->val).p != '\0') {
          uVar3 = mbedtls_asn1_write_bool(p,start,1);
          if ((int)uVar3 < 0) goto LAB_0010c42a;
          lVar4 = lVar4 + (ulong)uVar3;
        }
        uVar1 = mbedtls_asn1_write_raw_buffer(p,start,(first->oid).p,(first->oid).len);
        uVar3 = uVar1;
        if (((-1 < (int)uVar1) &&
            (uVar2 = mbedtls_asn1_write_len(p,start,(first->oid).len), uVar3 = uVar2,
            -1 < (int)uVar2)) && (uVar3 = mbedtls_asn1_write_tag(p,start,'\x06'), -1 < (int)uVar3))
        {
          len = lVar4 + (ulong)uVar3 + (ulong)uVar2 + (ulong)uVar1;
          uVar1 = mbedtls_asn1_write_len(p,start,len);
          uVar3 = uVar1;
          if ((-1 < (int)uVar1) && (uVar3 = mbedtls_asn1_write_tag(p,start,'0'), -1 < (int)uVar3)) {
            uVar3 = uVar1 + (int)len + uVar3;
          }
        }
      }
LAB_0010c42a:
      if ((int)uVar3 < 0) {
        return uVar3;
      }
      iVar5 = iVar5 + uVar3;
      first = first->next;
    } while (first != (mbedtls_asn1_named_data *)0x0);
  }
  return iVar5;
}

Assistant:

int mbedtls_x509_write_extensions( unsigned char **p, unsigned char *start,
                           mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur_ext = first;

    while( cur_ext != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_extension( p, start, cur_ext ) );
        cur_ext = cur_ext->next;
    }

    return( (int) len );
}